

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::SmallVectorBase<std::filesystem::__cxx11::path>::
emplace_back<std::filesystem::__cxx11::path_const&>
          (SmallVectorBase<std::filesystem::__cxx11::path> *this,path *args)

{
  size_type sVar1;
  pointer ppVar2;
  
  if (this->len == this->cap) {
    ppVar2 = emplaceRealloc<std::filesystem::__cxx11::path_const&>
                       (this,this->data_ + this->len,args);
    return ppVar2;
  }
  std::filesystem::__cxx11::path::path(this->data_ + this->len,args);
  sVar1 = this->len;
  this->len = sVar1 + 1;
  return this->data_ + sVar1;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }